

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode pubkey_pem_to_der(char *pem,uchar **der,size_t *der_len)

{
  char cVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  char *src;
  long lVar5;
  
  pcVar3 = strstr(pem,"-----BEGIN PUBLIC KEY-----");
  CVar2 = CURLE_BAD_CONTENT_ENCODING;
  if ((pcVar3 != (char *)0x0) &&
     (((lVar5 = (long)pcVar3 - (long)pem, lVar5 == 0 || (pem[lVar5 + -1] == '\n')) &&
      (pcVar4 = strstr(pem + lVar5 + 0x1a,"\n-----END PUBLIC KEY-----"), pcVar4 != (char *)0x0)))) {
    src = (char *)(*Curl_cmalloc)((((long)pcVar4 - (long)pem) - lVar5) - 0x19);
    if (src == (char *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      if (lVar5 + 0x1aU < (ulong)((long)pcVar4 - (long)pem)) {
        pcVar3 = pcVar3 + 0x1a;
        lVar5 = 0;
        do {
          cVar1 = *pcVar3;
          if ((cVar1 != '\n') && (cVar1 != '\r')) {
            src[lVar5] = cVar1;
            lVar5 = lVar5 + 1;
          }
          pcVar3 = pcVar3 + 1;
        } while (pcVar4 != pcVar3);
      }
      else {
        lVar5 = 0;
      }
      src[lVar5] = '\0';
      CVar2 = Curl_base64_decode(src,der,der_len);
      (*Curl_cfree)(src);
    }
  }
  return CVar2;
}

Assistant:

static CURLcode pubkey_pem_to_der(const char *pem,
                                  unsigned char **der, size_t *der_len)
{
  char *stripped_pem, *begin_pos, *end_pos;
  size_t pem_count, stripped_pem_count = 0, pem_len;
  CURLcode result;

  /* if no pem, exit. */
  if(!pem)
    return CURLE_BAD_CONTENT_ENCODING;

  begin_pos = strstr(pem, "-----BEGIN PUBLIC KEY-----");
  if(!begin_pos)
    return CURLE_BAD_CONTENT_ENCODING;

  pem_count = begin_pos - pem;
  /* Invalid if not at beginning AND not directly following \n */
  if(0 != pem_count && '\n' != pem[pem_count - 1])
    return CURLE_BAD_CONTENT_ENCODING;

  /* 26 is length of "-----BEGIN PUBLIC KEY-----" */
  pem_count += 26;

  /* Invalid if not directly following \n */
  end_pos = strstr(pem + pem_count, "\n-----END PUBLIC KEY-----");
  if(!end_pos)
    return CURLE_BAD_CONTENT_ENCODING;

  pem_len = end_pos - pem;

  stripped_pem = malloc(pem_len - pem_count + 1);
  if(!stripped_pem)
    return CURLE_OUT_OF_MEMORY;

  /*
   * Here we loop through the pem array one character at a time between the
   * correct indices, and place each character that is not '\n' or '\r'
   * into the stripped_pem array, which should represent the raw base64 string
   */
  while(pem_count < pem_len) {
    if('\n' != pem[pem_count] && '\r' != pem[pem_count])
      stripped_pem[stripped_pem_count++] = pem[pem_count];
    ++pem_count;
  }
  /* Place the null terminator in the correct place */
  stripped_pem[stripped_pem_count] = '\0';

  result = Curl_base64_decode(stripped_pem, der, der_len);

  Curl_safefree(stripped_pem);

  return result;
}